

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O2

ulong __thiscall
CVmObjStrComp::write_to_stream(CVmObjStrComp *this,CVmStream *str,ulong *bytes_avail)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long *plVar6;
  uint *puVar7;
  long lVar8;
  long lVar9;
  size_t equiv_cnt;
  size_t total_value_ch;
  ulong local_40;
  ulong local_38;
  
  puVar7 = (uint *)(this->super_CVmObject).ext_;
  count_equiv_mappings(this,&local_40,&local_38);
  uVar4 = local_40 * 0xb + local_38 * 2 + 8;
  if ((bytes_avail == (ulong *)0x0) || (uVar4 <= *bytes_avail)) {
    (*str->_vptr_CVmStream[0xb])(str,(ulong)*puVar7);
    (*str->_vptr_CVmStream[0xb])(str,(ulong)(puVar7[2] != 0));
    (*str->_vptr_CVmStream[0xb])(str,local_40 & 0xffffffff);
    (*str->_vptr_CVmStream[0xb])(str,local_38 & 0xffffffff);
    puVar7 = puVar7 + 4;
    uVar3 = 0;
    for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
      plVar6 = *(long **)puVar7;
      if (plVar6 != (long *)0x0) {
        for (lVar8 = 0; lVar8 != 0x100; lVar8 = lVar8 + 1) {
          if (*plVar6 != 0) {
            (*str->_vptr_CVmStream[0xb])(str,(ulong)(uVar3 | (uint)lVar8));
            (*str->_vptr_CVmStream[4])(str,(ulong)*(byte *)*plVar6);
            (*str->_vptr_CVmStream[0xd])(str,*(undefined8 *)(*plVar6 + 0x10));
            (*str->_vptr_CVmStream[0xd])(str,*(undefined8 *)(*plVar6 + 0x18));
            lVar1 = *(long *)*plVar6;
            lVar2 = ((long *)*plVar6)[1];
            for (lVar9 = 0; lVar1 != lVar9; lVar9 = lVar9 + 1) {
              (*str->_vptr_CVmStream[0xb])(str,(ulong)*(uint *)(lVar2 + lVar9 * 4));
            }
          }
          plVar6 = plVar6 + 1;
        }
      }
      puVar7 = puVar7 + 2;
      uVar3 = uVar3 + 0x100;
    }
  }
  return uVar4;
}

Assistant:

ulong CVmObjStrComp::write_to_stream(VMG_ CVmStream *str, ulong *bytes_avail)
{
    wchar_t ref_ch_base;
    vmobj_strcmp_ext *ext = get_ext();
    size_t i;
    vmobj_strcmp_equiv ***p;
    size_t total_value_ch;
    size_t equiv_cnt;
    size_t need_size;

    /* get the mapping totals */
    count_equiv_mappings(&equiv_cnt, &total_value_ch);

    /* 
     *   Calculate our space needs.  We need 8 bytes for the fixed header,
     *   11 bytes per equivalent mapping, and 2 bytes per value string
     *   character. 
     */
    need_size = 8 + (11 * equiv_cnt) + (2 * total_value_ch);
    
    /* if we have a size limit, check to make sure we can abide by it */
    if (bytes_avail != 0 && need_size > *bytes_avail)
    {
        /* 
         *   there's not enough space in the output stream for us, so don't
         *   write anything at all; simply return the amount of space we
         *   need 
         */
        return need_size;
    }

    /* write out the serialization structure header */
    str->write_uint2(ext->trunc_len);
    str->write_uint2(ext->case_sensitive ? 0x0001 : 0x0000);
    str->write_uint2(equiv_cnt);
    str->write_uint2(total_value_ch);

    /* run through our equivalence table again and write the mappings */
    for (ref_ch_base = 0, i = 0, p = ext->equiv ; i < countof(ext->equiv) ;
         ++i, ++p, ref_ch_base += 256)
    {
        vmobj_strcmp_equiv **ep;
        size_t j;

        /* if this first-tier mapping is unused, skip it */
        if (*p == 0)
            continue;

        /* run through our second-level table */
        for (j = 0, ep = *p ; j < 256 ; ++j, ++ep)
        {
            /* if this mapping is used, write it out */
            if (*ep != 0)
            {
                size_t k;
                wchar_t *vp;
                
                /* write the fixed part of the mapping */
                str->write_uint2(ref_ch_base + j);
                str->write_byte((uchar)(*ep)->val_ch_cnt);
                str->write_uint4((*ep)->uc_result_flags);
                str->write_uint4((*ep)->lc_result_flags);

                /* write the value mapping characters */
                for (k = (*ep)->val_ch_cnt, vp = (*ep)->val_ch ; k != 0 ;
                     --k, ++vp)
                {
                    /* write this character */
                    str->write_uint2(*vp);
                }
            }
        }
    }

    /* return our space needs */
    return need_size;
}